

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

void __thiscall leveldb::DBImpl::BackgroundCompaction(DBImpl *this)

{
  int iVar1;
  ManualCompaction *pMVar2;
  InternalKey *pIVar3;
  pointer ppFVar4;
  FileMetaData *pFVar5;
  Logger *info_log;
  Status SVar6;
  _Alloc_hider _Var7;
  bool bVar8;
  Compaction *this_00;
  char *pcVar9;
  CompactionState *compact;
  Status status;
  InternalKey manual_end;
  LevelSummaryStorage tmp;
  Status local_160;
  Mutex *local_158;
  Logger *local_150;
  ulong local_148;
  char *local_140;
  InternalKey local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  int local_98;
  undefined4 uStack_94;
  _Alloc_hider local_90;
  
  if (this->imm_ != (MemTable *)0x0) {
    CompactMemTable(this);
    return;
  }
  pMVar2 = this->manual_compaction_;
  local_138.rep_._M_dataplus._M_p = (pointer)&local_138.rep_.field_2;
  local_138.rep_._M_string_length = 0;
  local_138.rep_.field_2._M_local_buf[0] = '\0';
  if (pMVar2 == (ManualCompaction *)0x0) {
    this_00 = VersionSet::PickCompaction(this->versions_);
  }
  else {
    this_00 = VersionSet::CompactRange(this->versions_,pMVar2->level,pMVar2->begin,pMVar2->end);
    pMVar2->done = this_00 == (Compaction *)0x0;
    if (this_00 != (Compaction *)0x0) {
      std::__cxx11::string::_M_assign((string *)&local_138);
    }
    local_150 = (this->options_).info_log;
    local_148 = CONCAT44(local_148._4_4_,pMVar2->level);
    local_158 = (Mutex *)pMVar2->begin;
    if (local_158 == (Mutex *)0x0) {
      local_140 = "(begin)";
    }
    else {
      InternalKey::DebugString_abi_cxx11_(&local_b8,pMVar2->begin);
      local_140 = local_b8._M_dataplus._M_p;
    }
    pIVar3 = pMVar2->end;
    if (pIVar3 == (InternalKey *)0x0) {
      pcVar9 = "(end)";
    }
    else {
      InternalKey::DebugString_abi_cxx11_(&local_d8,pMVar2->end);
      pcVar9 = local_d8._M_dataplus._M_p;
    }
    if (pMVar2->done == false) {
      InternalKey::DebugString_abi_cxx11_(&local_118,&local_138);
      Log(local_150,"Manual compaction at level-%d from %s .. %s; will stop at %s\n",
          local_148 & 0xffffffff,local_140,pcVar9,local_118._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
    }
    else {
      Log(local_150,"Manual compaction at level-%d from %s .. %s; will stop at %s\n",
          local_148 & 0xffffffff,local_140,pcVar9,"(end)");
    }
    if ((pIVar3 != (InternalKey *)0x0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2)) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((local_158 != (Mutex *)0x0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2)) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
  }
  local_160.state_ = (char *)0x0;
  if (this_00 != (Compaction *)0x0) {
    if ((pMVar2 == (ManualCompaction *)0x0) && (bVar8 = Compaction::IsTrivialMove(this_00), bVar8))
    {
      ppFVar4 = this_00->inputs_[0].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (((long)this_00->inputs_[0].
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar4 & 0x7fffffff8U) != 8) {
        __assert_fail("c->num_input_files(0) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                      ,0x2d9,"void leveldb::DBImpl::BackgroundCompaction()");
      }
      local_158 = &this->mutex_;
      pFVar5 = *ppFVar4;
      local_90._M_p = (pointer)pFVar5->number;
      local_98 = this_00->level_;
      std::
      _Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
      ::_M_insert_unique<std::pair<int,unsigned_long>>
                ((_Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
                  *)&(this_00->edit_).deleted_files_,
                 (pair<int,_unsigned_long> *)&stack0xffffffffffffff68);
      VersionEdit::AddFile
                (&this_00->edit_,this_00->level_ + 1,pFVar5->number,pFVar5->file_size,
                 &pFVar5->smallest,&pFVar5->largest);
      VersionSet::LogAndApply
                ((VersionSet *)&stack0xffffffffffffff68,(VersionEdit *)this->versions_,
                 (Mutex *)&this_00->edit_);
      SVar6.state_ = local_160.state_;
      local_160.state_ = _local_98;
      _local_98 = SVar6.state_;
      if ((Env *)SVar6.state_ != (Env *)0x0) {
        operator_delete__(SVar6.state_);
      }
      if ((Env *)local_160.state_ != (Env *)0x0) {
        RecordBackgroundError(this,&local_160);
      }
      local_158 = (Mutex *)(this->options_).info_log;
      iVar1 = this_00->level_;
      local_150 = (Logger *)pFVar5->number;
      local_148 = pFVar5->file_size;
      Status::ToString_abi_cxx11_(&local_f8,&local_160);
      _Var7._M_p = local_f8._M_dataplus._M_p;
      pcVar9 = VersionSet::LevelSummary
                         (this->versions_,(LevelSummaryStorage *)&stack0xffffffffffffff68);
      Log((Logger *)local_158,"Moved #%lld to level-%d %lld bytes %s: %s\n",local_150,
          (ulong)(iVar1 + 1),local_148,_Var7._M_p,pcVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
    }
    else {
      compact = (CompactionState *)operator_new(0x40);
      compact->compaction = this_00;
      compact->smallest_snapshot = 0;
      (compact->outputs).
      super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (compact->outputs).
      super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (compact->outputs).
      super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      compact->outfile = (WritableFile *)0x0;
      compact->builder = (TableBuilder *)0x0;
      compact->total_bytes = 0;
      DoCompactionWork((DBImpl *)&stack0xffffffffffffff68,(CompactionState *)this);
      SVar6.state_ = local_160.state_;
      local_160.state_ = _local_98;
      _local_98 = SVar6.state_;
      if ((Env *)SVar6.state_ != (Env *)0x0) {
        operator_delete__(SVar6.state_);
      }
      if ((Env *)local_160.state_ != (Env *)0x0) {
        RecordBackgroundError(this,&local_160);
      }
      CleanupCompaction(this,compact);
      Compaction::ReleaseInputs(this_00);
      RemoveObsoleteFiles(this);
    }
    Compaction::~Compaction(this_00);
    operator_delete(this_00);
  }
  if (((Env *)local_160.state_ != (Env *)0x0) && (((this->shutting_down_)._M_base._M_i & 1U) == 0))
  {
    info_log = (this->options_).info_log;
    Status::ToString_abi_cxx11_((string *)&stack0xffffffffffffff68,&local_160);
    Log(info_log,"Compaction error: %s",_local_98);
    if ((Env *)_local_98 != (Env *)&stack0xffffffffffffff78) {
      operator_delete(_local_98);
    }
  }
  if (pMVar2 != (ManualCompaction *)0x0) {
    pMVar2 = this->manual_compaction_;
    if ((Env *)local_160.state_ != (Env *)0x0) {
      pMVar2->done = true;
    }
    if (pMVar2->done == false) {
      std::__cxx11::string::_M_assign((string *)&pMVar2->tmp_storage);
      pMVar2->begin = &pMVar2->tmp_storage;
    }
    this->manual_compaction_ = (ManualCompaction *)0x0;
  }
  if ((Env *)local_160.state_ != (Env *)0x0) {
    operator_delete__(local_160.state_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.rep_._M_dataplus._M_p != &local_138.rep_.field_2) {
    operator_delete(local_138.rep_._M_dataplus._M_p);
  }
  return;
}

Assistant:

void DBImpl::BackgroundCompaction() {
  mutex_.AssertHeld();

  if (imm_ != nullptr) {
    CompactMemTable();
    return;
  }

  Compaction* c;
  bool is_manual = (manual_compaction_ != nullptr);
  InternalKey manual_end;
  if (is_manual) {
    ManualCompaction* m = manual_compaction_;
    c = versions_->CompactRange(m->level, m->begin, m->end);
    m->done = (c == nullptr);
    if (c != nullptr) {
      manual_end = c->input(0, c->num_input_files(0) - 1)->largest;
    }
    Log(options_.info_log,
        "Manual compaction at level-%d from %s .. %s; will stop at %s\n",
        m->level, (m->begin ? m->begin->DebugString().c_str() : "(begin)"),
        (m->end ? m->end->DebugString().c_str() : "(end)"),
        (m->done ? "(end)" : manual_end.DebugString().c_str()));
  } else {
    c = versions_->PickCompaction();
  }

  Status status;
  if (c == nullptr) {
    // Nothing to do
  } else if (!is_manual && c->IsTrivialMove()) {
    // Move file to next level
    assert(c->num_input_files(0) == 1);
    FileMetaData* f = c->input(0, 0);
    c->edit()->RemoveFile(c->level(), f->number);
    c->edit()->AddFile(c->level() + 1, f->number, f->file_size, f->smallest,
                       f->largest);
    status = versions_->LogAndApply(c->edit(), &mutex_);
    if (!status.ok()) {
      RecordBackgroundError(status);
    }
    VersionSet::LevelSummaryStorage tmp;
    Log(options_.info_log, "Moved #%lld to level-%d %lld bytes %s: %s\n",
        static_cast<unsigned long long>(f->number), c->level() + 1,
        static_cast<unsigned long long>(f->file_size),
        status.ToString().c_str(), versions_->LevelSummary(&tmp));
  } else {
    CompactionState* compact = new CompactionState(c);
    status = DoCompactionWork(compact);
    if (!status.ok()) {
      RecordBackgroundError(status);
    }
    CleanupCompaction(compact);
    c->ReleaseInputs();
    RemoveObsoleteFiles();
  }
  delete c;

  if (status.ok()) {
    // Done
  } else if (shutting_down_.load(std::memory_order_acquire)) {
    // Ignore compaction errors found during shutting down
  } else {
    Log(options_.info_log, "Compaction error: %s", status.ToString().c_str());
  }

  if (is_manual) {
    ManualCompaction* m = manual_compaction_;
    if (!status.ok()) {
      m->done = true;
    }
    if (!m->done) {
      // We only compacted part of the requested range.  Update *m
      // to the range that is left to be compacted.
      m->tmp_storage = manual_end;
      m->begin = &m->tmp_storage;
    }
    manual_compaction_ = nullptr;
  }
}